

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

string * __thiscall
pbrt::MediumSample::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumSample *this)

{
  SampledSpectrum *in_R8;
  
  StringPrintf<pbrt::MediumInteraction_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,(pbrt *)"[ MediumSample intr: %s Tmaj: %s ]",(char *)this,
             (MediumInteraction *)&this->Tmaj,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string MediumSample::ToString() const {
    return StringPrintf("[ MediumSample intr: %s Tmaj: %s ]", intr, Tmaj);
}